

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O3

uint64_t bigendian_decode_varlen(uint8_t *bytes,uint_fast8_t n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  ulong uVar5;
  undefined3 in_register_00000031;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  
  if (CONCAT31(in_register_00000031,n) == 0) {
    return 0;
  }
  auVar8 = vpbroadcastq_avx512vl();
  auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  uVar5 = 0;
  auVar10._8_8_ = 0x38;
  auVar10._0_8_ = 0x38;
  auVar10._16_8_ = 0x38;
  auVar10._24_8_ = 0x38;
  auVar11._8_8_ = 4;
  auVar11._0_8_ = 4;
  auVar11._16_8_ = 4;
  auVar11._24_8_ = 4;
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar12 = auVar4;
    uVar6 = vpcmpuq_avx512vl(auVar9,auVar8,2);
    uVar6 = uVar6 & 0xf;
    auVar7 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(bytes + uVar5));
    auVar3 = vpmovzxbq_avx2(ZEXT416(CONCAT13((char)(uVar6 >> 3) * auVar7[3],
                                             CONCAT12(((byte)(uVar6 >> 2) & 1) * auVar7[2],
                                                      CONCAT11(((byte)(uVar6 >> 1) & 1) * auVar7[1],
                                                               ((byte)uVar6 & 1) * auVar7[0])))));
    auVar13 = vpsllq_avx2(auVar9,3);
    auVar13 = vpsubq_avx2(auVar10,auVar13);
    auVar3 = vpsllvq_avx2(auVar3,auVar13);
    auVar3 = vpor_avx2(auVar3,auVar12._0_32_);
    uVar5 = uVar5 + 4;
    auVar9 = vpaddq_avx2(auVar9,auVar11);
    auVar4 = ZEXT3264(auVar3);
  } while ((n + 3 & 0xfffffffc) != uVar5);
  auVar9 = vmovdqa64_avx512vl(auVar3);
  bVar1 = (bool)((byte)uVar6 & 1);
  auVar7._0_8_ = (ulong)bVar1 * auVar9._0_8_ | (ulong)!bVar1 * auVar12._0_8_;
  bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar7._8_8_ = (ulong)bVar1 * auVar9._8_8_ | (ulong)!bVar1 * auVar12._8_8_;
  bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar8._16_8_ = (ulong)bVar1 * auVar9._16_8_ | (ulong)!bVar1 * auVar12._16_8_;
  auVar8._0_16_ = auVar7;
  auVar8._24_8_ = (uVar6 >> 3) * auVar9._24_8_ | (ulong)!SUB81(uVar6 >> 3,0) * auVar12._24_8_;
  auVar7 = vpor_avx(auVar7,auVar8._16_16_);
  auVar2 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpor_avx(auVar7,auVar2);
  return auVar7._0_8_;
}

Assistant:

ASCON_INLINE uint64_t
bigendian_decode_varlen(const uint8_t* const bytes, const uint_fast8_t n)
{
    uint64_t x = 0;
    // Unsigned int should be the fastest unsigned on the machine.
    // Using it to avoid warnings about <<-operator with signed value.
    for (unsigned int i = 0; i < n; i++)
    {
        x |= ((uint64_t) bytes[i]) << (56U - 8U * i);
    }
    return x;
}